

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Deconvolution_x86_avx512::forward
          (Deconvolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  void *pvVar4;
  int *piVar5;
  Allocator *pAVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  size_t sVar10;
  undefined8 uVar11;
  undefined1 auVar12 [24];
  int iVar13;
  int iVar14;
  int iVar15;
  undefined8 *puVar16;
  long lVar17;
  float *pfVar18;
  int iVar19;
  Mat *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar20;
  undefined1 auVar21 [64];
  float fVar22;
  float fVar23;
  float w_2;
  int k;
  float val;
  int sx;
  int sxs;
  int x;
  float *sptr_4;
  int sy;
  int sys;
  int y;
  Mat m_6;
  int q;
  int in_stack_00000668;
  int in_stack_00000670;
  float *kptr;
  float sum;
  int j_4;
  int i_11;
  int outh_1;
  int outw_1;
  int channels;
  int h_1;
  int w_1;
  float *outptr;
  int p_4;
  int j_3;
  int i_10;
  float *ptr_10;
  int v_3;
  int u_3;
  float bias;
  Mat outm_3;
  float *sptr_3;
  int p_3;
  __m128 _s_2;
  __m128 _val_2;
  int j_2;
  int i_8;
  float *ptr_8;
  int v_2;
  int u_2;
  Mat outm_2;
  float *sptr_2;
  int p_2;
  __m256 _s_1;
  __m256 _val_1;
  int j_1;
  int i_5;
  float *ptr_5;
  int v_1;
  int u_1;
  Mat outm_1;
  float *sptr_1;
  int p_1;
  __m512 _s;
  __m512 _val;
  int j;
  int i_2;
  float *ptr_2;
  int v;
  int u;
  Mat outm;
  float *sptr;
  int p;
  int gap;
  int ret;
  Option opt_b;
  Mat top_col2im;
  Mat bottom_blob_2;
  int maxk;
  int in_stack_00000a98;
  int in_stack_00000aa0;
  Mat top_blob_bordered;
  int out_channels;
  size_t out_elemsize;
  int out_elempack;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  int elempack;
  size_t elemsize;
  int h;
  int w;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  int i_1;
  float *ptr_1;
  int size_1;
  int in_stack_00000f58;
  int in_stack_00000f60;
  int in_stack_00000f68;
  int in_stack_00000f70;
  int in_stack_00000f78;
  Mat *in_stack_00000f80;
  Option *in_stack_00000f88;
  int i;
  float *ptr;
  int size;
  int i_4;
  float *ptr_4;
  int size_3;
  int i_3;
  float *ptr_3;
  int size_2;
  int i_7;
  float *ptr_7;
  int size_5;
  int i_6;
  float *ptr_6;
  int size_4;
  int i_9;
  float *ptr_9;
  int size_6;
  Mat *m_7;
  Mat *m_5;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  int in_stack_ffffffffffffe5dc;
  undefined4 in_stack_ffffffffffffe5e0;
  undefined4 in_stack_ffffffffffffe5e4;
  undefined8 in_stack_ffffffffffffe5e8;
  undefined8 in_stack_ffffffffffffe5f0;
  Mat *in_stack_ffffffffffffe5f8;
  Mat *in_stack_ffffffffffffe600;
  Mat *in_stack_ffffffffffffe608;
  undefined7 in_stack_ffffffffffffe610;
  undefined1 in_stack_ffffffffffffe617;
  float local_19d4;
  Allocator *in_stack_ffffffffffffe658;
  undefined4 local_1910;
  int in_stack_ffffffffffffe7e8;
  int in_stack_ffffffffffffe7ec;
  undefined4 in_stack_ffffffffffffe7f0;
  undefined4 in_stack_ffffffffffffe7f4;
  undefined4 in_stack_ffffffffffffe7f8;
  undefined4 in_stack_ffffffffffffe7fc;
  Mat *in_stack_ffffffffffffe800;
  Mat *in_stack_ffffffffffffe808;
  Mat *in_stack_ffffffffffffe810;
  Mat *in_stack_ffffffffffffe818;
  Mat *in_stack_ffffffffffffe820;
  Mat *in_stack_ffffffffffffe828;
  undefined8 in_stack_ffffffffffffe838;
  Mat *in_stack_ffffffffffffe840;
  Mat *in_stack_ffffffffffffe848;
  Mat *in_stack_ffffffffffffe850;
  Mat *in_stack_ffffffffffffe858;
  undefined8 in_stack_ffffffffffffe8a8;
  Mat *in_stack_ffffffffffffe8b0;
  Mat *in_stack_ffffffffffffe8b8;
  undefined7 in_stack_ffffffffffffe8c0;
  undefined1 in_stack_ffffffffffffe8c7;
  Mat *in_stack_ffffffffffffe8c8;
  undefined7 in_stack_ffffffffffffe8d0;
  undefined1 in_stack_ffffffffffffe8d7;
  Mat *in_stack_ffffffffffffe8d8;
  Mat *in_stack_ffffffffffffe8e0;
  Mat *in_stack_ffffffffffffe8e8;
  Mat *in_stack_ffffffffffffe8f0;
  Mat *in_stack_ffffffffffffe8f8;
  Mat *top_blob_00;
  undefined8 uStack_16d0;
  undefined1 local_1700 [64];
  undefined8 uStack_16c8;
  undefined8 in_stack_ffffffffffffe958;
  Mat *in_stack_ffffffffffffe960;
  Mat *in_stack_ffffffffffffe968;
  Mat *in_stack_ffffffffffffe970;
  Mat *in_stack_ffffffffffffe978;
  int in_stack_ffffffffffffea48;
  int in_stack_ffffffffffffea4c;
  Mat *in_stack_ffffffffffffea50;
  int in_stack_ffffffffffffea58;
  int in_stack_ffffffffffffea5c;
  Mat *in_stack_ffffffffffffea60;
  Mat *in_stack_ffffffffffffea68;
  Mat *in_stack_ffffffffffffea70;
  Mat *in_stack_ffffffffffffea78;
  bool local_14b9;
  int local_14a0;
  int local_149c;
  int local_147c;
  int local_1464;
  undefined8 local_1460;
  undefined8 local_1458;
  undefined8 local_1450;
  undefined4 local_1448;
  long local_1440;
  undefined4 local_1438;
  undefined4 local_1434;
  undefined4 local_1430;
  undefined4 local_142c;
  undefined4 local_1428;
  undefined8 local_1420;
  int in_stack_ffffffffffffebe8;
  int in_stack_ffffffffffffebec;
  int iVar24;
  Mat *in_stack_ffffffffffffebf0;
  Mat *in_stack_ffffffffffffebf8;
  Mat *in_stack_ffffffffffffec00;
  Mat *in_stack_ffffffffffffec08;
  int in_stack_ffffffffffffec18;
  int in_stack_ffffffffffffec20;
  int in_stack_ffffffffffffec28;
  int in_stack_ffffffffffffec30;
  int in_stack_ffffffffffffec38;
  undefined4 in_stack_ffffffffffffec40;
  undefined4 in_stack_ffffffffffffec44;
  int in_stack_ffffffffffffec48;
  int iVar25;
  int in_stack_ffffffffffffec4c;
  int iVar26;
  undefined4 in_stack_ffffffffffffec50;
  int iVar27;
  undefined4 in_stack_ffffffffffffec54;
  undefined4 in_stack_ffffffffffffec58;
  int iVar28;
  undefined4 in_stack_ffffffffffffec5c;
  Mat *in_stack_ffffffffffffec60;
  Mat *in_stack_ffffffffffffec68;
  void **local_1358;
  int local_134c;
  int local_1348;
  int local_1344;
  float *local_1340;
  int local_1334;
  int local_1330;
  undefined8 local_1328;
  undefined8 local_1320;
  undefined8 local_1318;
  undefined4 local_1310;
  long *local_1308;
  undefined4 local_1300;
  undefined4 local_12fc;
  undefined4 local_12f8;
  undefined4 local_12f4;
  undefined4 local_12f0;
  undefined8 local_12e8;
  float *local_12e0;
  int local_12d4;
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  int local_12b0;
  int local_12ac;
  undefined8 *local_12a8;
  int local_12a0;
  int local_129c;
  undefined8 local_1298;
  undefined8 local_1290;
  undefined8 local_1288;
  undefined4 local_1280;
  long *local_1278;
  undefined4 local_1270;
  undefined4 local_126c;
  undefined4 local_1268;
  undefined4 local_1264;
  undefined4 local_1260;
  undefined8 local_1258;
  undefined8 *local_1250;
  int local_1244;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  int local_11f0;
  int local_11ec;
  undefined1 (*local_11e8) [24];
  int local_11e0;
  int local_11dc;
  undefined8 local_11d8;
  undefined8 local_11d0;
  undefined8 local_11c8;
  undefined4 local_11c0;
  long *local_11b8;
  undefined4 local_11b0;
  undefined4 local_11ac;
  undefined4 local_11a8;
  undefined4 local_11a4;
  undefined4 local_11a0;
  undefined8 local_1198;
  undefined8 *local_1190;
  int local_1184;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 uStack_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  int local_10f8;
  int local_10f4;
  undefined1 (*local_10f0) [64];
  int local_10e8;
  int local_10e4;
  undefined8 local_10e0;
  undefined8 local_10d8;
  undefined8 local_10d0;
  undefined4 local_10c8;
  long *local_10c0;
  undefined4 local_10b8;
  undefined4 local_10b4;
  undefined4 local_10b0;
  undefined4 local_10ac;
  undefined4 local_10a8;
  undefined8 local_10a0;
  undefined1 (*local_1098) [64];
  int local_108c;
  int local_1088;
  int local_1084;
  undefined8 local_1080;
  long *plStack_1078;
  undefined1 auStack_1070 [48];
  void *local_1040;
  int *local_1038;
  long local_1030;
  undefined4 local_1028;
  long *local_1020;
  undefined4 local_1018;
  int local_1014;
  undefined4 local_1010;
  undefined4 local_100c;
  undefined4 local_1008;
  undefined8 local_1000;
  void *local_ff8;
  int *local_ff0;
  long local_fe8;
  undefined4 local_fe0;
  long *local_fd8;
  undefined4 local_fd0;
  int local_fcc;
  undefined4 local_fc8;
  undefined4 local_fc4;
  undefined4 local_fc0;
  long local_fb8;
  int local_fac;
  int in_stack_fffffffffffff058;
  int iVar29;
  int in_stack_fffffffffffff05c;
  Mat *in_stack_fffffffffffff060;
  Mat *weight_data_packed_00;
  Mat *top_blob_02;
  Mat *bottom_blob_02;
  undefined4 local_f80;
  long *local_f78;
  int local_f70;
  int local_f6c;
  int local_f68;
  int local_f64;
  int local_f60;
  long local_f58;
  int local_f40;
  int local_ef4;
  int local_b14;
  void **local_b10;
  int local_a94;
  void **local_a90;
  int local_894;
  Allocator **local_890;
  int local_854;
  Allocator **local_850;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 in_stack_fffffffffffff888;
  Mat *in_stack_fffffffffffff890;
  Mat *in_stack_fffffffffffff898;
  Mat *in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8ac;
  int iVar30;
  void **local_750;
  int local_724;
  void **local_720;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float local_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  int local_664;
  void **local_660;
  float local_5c4;
  float local_5c0;
  float local_5bc;
  float local_5b8;
  float local_5b4;
  long *local_5b0;
  undefined4 local_5a8;
  float local_5a4 [3];
  long *local_598;
  undefined8 local_590;
  long *local_588;
  undefined8 local_580;
  long *local_578;
  undefined8 local_570;
  long *local_568;
  undefined8 local_560;
  long *local_558;
  undefined8 local_550;
  undefined4 local_544;
  long local_540;
  long local_538;
  undefined4 local_52c;
  int local_528;
  int local_524;
  undefined1 *local_520;
  long local_518;
  undefined4 local_50c;
  long local_508;
  long local_500;
  undefined4 local_4f4;
  int local_4f0;
  int local_4ec;
  undefined8 *local_4e8;
  undefined4 local_4d4;
  void **local_4c8;
  int local_4bc;
  undefined8 *local_4b0;
  undefined4 local_49c;
  Allocator **local_490;
  int local_484;
  undefined8 *local_478;
  undefined4 local_464;
  void **local_458;
  int local_44c;
  undefined8 *local_440;
  undefined4 local_42c;
  void **local_420;
  int local_414;
  undefined8 *local_408;
  undefined4 local_3f4;
  void **local_3e8;
  int local_3dc;
  undefined1 *local_3d0;
  undefined4 local_3c4;
  long local_3c0;
  undefined4 local_3b4;
  long local_3b0;
  undefined4 local_3a4;
  long local_3a0;
  undefined4 local_394;
  long local_390;
  undefined4 local_384;
  long local_380;
  undefined4 local_374;
  long local_370;
  undefined4 local_364;
  long local_360;
  void *local_2e0;
  void *local_2d0;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined1 *local_240;
  long *local_238;
  long *local_230;
  long *local_228;
  long *local_220;
  int local_210;
  undefined4 local_20c;
  void **local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  void **local_188;
  void *local_180;
  int *piStack_178;
  size_t sStack_170;
  undefined8 uStack_168;
  Allocator *pAStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  void **local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  Allocator **local_e8;
  Allocator *local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  Allocator **local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  void **local_98;
  void *local_90;
  int *piStack_88;
  void **local_78;
  Mat *bottom_blob_00;
  Mat *bias_data;
  Mat *weight_data_packed;
  Mat *top_blob_01;
  Mat *bottom_blob_01;
  
  iVar25 = (int)((ulong)in_stack_ffffffffffffe5e8 >> 0x20);
  iVar29 = *(int *)((long)in_RSI + 0x2c);
  iVar28 = (int)in_RSI[6];
  iVar30 = (int)in_RSI[3];
  iVar13 = *(int *)(in_RDI + 0xdc) * (*(int *)(in_RDI + 0xd4) + -1);
  iVar1 = *(int *)(in_RDI + 0xe0);
  iVar2 = *(int *)(in_RDI + 0xd8);
  iVar26 = *(int *)(in_RDI + 0xe4);
  iVar27 = *(int *)(in_RDI + 0xfc);
  local_f40 = 1;
  if (((ulong)in_RCX->allocator & 0x100000000000000) != 0) {
    if (*(int *)(in_RDI + 0xd0) % 0x10 == 0) {
      local_149c = 0x10;
    }
    else {
      if (*(int *)(in_RDI + 0xd0) % 8 == 0) {
        local_14a0 = 8;
      }
      else {
        local_14a0 = 1;
        if (*(int *)(in_RDI + 0xd0) % 4 == 0) {
          local_14a0 = 4;
        }
      }
      local_149c = local_14a0;
    }
    local_f40 = local_149c;
  }
  iVar19 = *(int *)(in_RDI + 0xd0) / local_f40;
  weight_data_packed_00 = (Mat *)0x0;
  top_blob_02 = (Mat *)0x0;
  bottom_blob_02 = (Mat *)0x0;
  local_f80 = 0;
  local_f78 = (long *)0x0;
  local_f70 = 0;
  local_f6c = 0;
  local_f68 = 0;
  local_f64 = 0;
  local_f60 = 0;
  local_f58 = 0;
  iVar24 = (int)((ulong)in_stack_ffffffffffffe5f0 >> 0x20);
  if ((((*(int *)(in_RDI + 0xec) < 1) && (*(int *)(in_RDI + 0xf0) < 1)) &&
      (*(int *)(in_RDI + 0xf4) < 1)) &&
     ((*(int *)(in_RDI + 0xf8) < 1 &&
      ((*(int *)(in_RDI + 0x104) < 1 || (*(int *)(in_RDI + 0x108) < 1)))))) {
    if ((long *)&stack0xfffffffffffff068 != in_RDX) {
      if (in_RDX[1] != 0) {
        LOCK();
        *(int *)in_RDX[1] = *(int *)in_RDX[1] + 1;
        UNLOCK();
      }
      weight_data_packed_00 = (Mat *)*in_RDX;
      top_blob_02 = (Mat *)in_RDX[1];
      bottom_blob_02 = (Mat *)in_RDX[2];
      local_f80 = (undefined4)in_RDX[3];
      local_f78 = (long *)in_RDX[4];
      local_f70 = (int)in_RDX[5];
      local_f6c = *(int *)((long)in_RDX + 0x2c);
      local_f68 = (int)in_RDX[6];
      local_f64 = *(int *)((long)in_RDX + 0x34);
      local_f60 = (int)in_RDX[7];
      local_f58 = in_RDX[8];
    }
    Mat::create(in_stack_ffffffffffffe5f8,iVar24,(int)in_stack_ffffffffffffe5f0,iVar25,
                CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0),
                in_stack_ffffffffffffe5dc,in_stack_ffffffffffffe658);
  }
  else {
    Mat::create(in_stack_ffffffffffffe5f8,iVar24,(int)in_stack_ffffffffffffe5f0,iVar25,
                CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0),
                in_stack_ffffffffffffe5dc,in_stack_ffffffffffffe658);
  }
  if (weight_data_packed_00 != (Mat *)0x0) {
    local_240 = &stack0xfffffffffffff068;
  }
  local_14b9 = weight_data_packed_00 != (Mat *)0x0 && local_f58 * local_f60 != 0;
  if (local_14b9) {
    local_fac = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
    if ((in_RCX->field_0x1d & 1) == 0) {
      iVar29 = (int)in_RDI;
      if ((iVar30 == 0x10) && (local_f40 == 0x10)) {
        deconvolution_pack16_avx512
                  ((Mat *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                   in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                   (int)((ulong)in_stack_fffffffffffff888 >> 0x20),(int)in_stack_fffffffffffff888,
                   *(int *)(in_RDI + 0xe0),*(int *)(in_RDI + 0xe4),*(int *)(in_RDI + 0xe8),
                   *(int *)(in_RDI + 0x114),iVar29 + 0x118,in_RCX,
                   (Option *)in_stack_ffffffffffffe5f8);
      }
      if ((iVar30 == 8) && (local_f40 == 0x10)) {
        deconvolution_pack8to16_avx512
                  (in_stack_ffffffffffffec68,in_stack_ffffffffffffec60,
                   (Mat *)CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58),
                   (Mat *)CONCAT44(in_stack_ffffffffffffec54,in_stack_ffffffffffffec50),
                   in_stack_ffffffffffffec4c,in_stack_ffffffffffffec48,*(int *)(in_RDI + 0xe0),
                   *(int *)(in_RDI + 0xe4),*(int *)(in_RDI + 0xe8),*(int *)(in_RDI + 0x114),
                   iVar29 + 0x118,in_RCX,(Option *)in_stack_ffffffffffffe5f8);
      }
      if ((iVar30 == 0x10) && (local_f40 == 8)) {
        deconvolution_pack16to8_avx512
                  (bottom_blob_02,top_blob_02,weight_data_packed_00,in_stack_fffffffffffff060,
                   in_stack_fffffffffffff05c,in_stack_fffffffffffff058,*(int *)(in_RDI + 0xe0),
                   *(int *)(in_RDI + 0xe4),*(int *)(in_RDI + 0xe8),*(int *)(in_RDI + 0x114),
                   iVar29 + 0x118,in_RCX,(Option *)in_stack_ffffffffffffe5f8);
      }
      if ((iVar30 == 4) && (local_f40 == 0x10)) {
        deconvolution_pack4to16_avx512
                  (in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
                   (Mat *)CONCAT44(in_stack_ffffffffffffea5c,in_stack_ffffffffffffea58),
                   in_stack_ffffffffffffea50,in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48,
                   *(int *)(in_RDI + 0xe0),*(int *)(in_RDI + 0xe4),*(int *)(in_RDI + 0xe8),
                   *(int *)(in_RDI + 0x114),iVar29 + 0x118,in_RCX,
                   (Option *)in_stack_ffffffffffffe5f8);
      }
      if ((iVar30 == 0x10) && (local_f40 == 4)) {
        deconvolution_pack16to4_avx512
                  (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
                   in_stack_ffffffffffffebf0,in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8,
                   in_stack_00000f58,in_stack_00000f60,in_stack_00000f68,in_stack_00000f70,
                   in_stack_00000f78,in_stack_00000f80,in_stack_00000f88);
      }
      if ((iVar30 == 1) && (local_f40 == 0x10)) {
        deconvolution_pack1to16_avx512
                  (in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8d8,
                   (Mat *)CONCAT17(in_stack_ffffffffffffe8d7,in_stack_ffffffffffffe8d0),
                   (int)((ulong)in_stack_ffffffffffffe8c8 >> 0x20),(int)in_stack_ffffffffffffe8c8,
                   *(int *)(in_RDI + 0xe0),*(int *)(in_RDI + 0xe4),*(int *)(in_RDI + 0xe8),
                   *(int *)(in_RDI + 0x114),iVar29 + 0x118,in_RCX,
                   (Option *)in_stack_ffffffffffffe5f8);
      }
      if ((iVar30 == 0x10) && (local_f40 == 1)) {
        deconvolution_pack16to1_avx512
                  (bottom_blob_01,top_blob_01,weight_data_packed,bias_data,local_1700._12_4_,
                   local_1700._8_4_,*(int *)(in_RDI + 0xe0),*(int *)(in_RDI + 0xe4),
                   *(int *)(in_RDI + 0xe8),*(int *)(in_RDI + 0x114),iVar29 + 0x118,in_RCX,
                   (Option *)in_stack_ffffffffffffe5f8);
      }
      if ((iVar30 == 8) && (local_f40 == 8)) {
        deconvolution_pack8_avx
                  (in_stack_ffffffffffffea78,in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,
                   in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea58,
                   *(int *)(in_RDI + 0xe0),*(int *)(in_RDI + 0xe4),*(int *)(in_RDI + 0xe8),
                   *(int *)(in_RDI + 0x114),iVar29 + 0x118,in_RCX,
                   (Option *)in_stack_ffffffffffffe5f8);
      }
      if ((iVar30 == 4) && (local_f40 == 8)) {
        deconvolution_pack4to8_avx
                  (in_stack_ffffffffffffe978,in_stack_ffffffffffffe970,in_stack_ffffffffffffe968,
                   in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20),
                   (int)in_stack_ffffffffffffe958,*(int *)(in_RDI + 0xe0),*(int *)(in_RDI + 0xe4),
                   *(int *)(in_RDI + 0xe8),*(int *)(in_RDI + 0x114),iVar29 + 0x118,in_RCX,
                   (Option *)in_stack_ffffffffffffe5f8);
      }
      if ((iVar30 == 8) && (local_f40 == 4)) {
        deconvolution_pack8to4_avx
                  (bottom_blob_00,top_blob_00,in_stack_ffffffffffffe8f8,in_stack_ffffffffffffe8f0,
                   (int)((ulong)in_stack_ffffffffffffe8e8 >> 0x20),(int)in_stack_ffffffffffffe8e8,
                   in_stack_00000a98,in_stack_00000aa0,(int)top_blob_bordered.data,
                   (int)top_blob_bordered.refcount,(int)top_blob_bordered.elemsize,
                   (Mat *)top_blob_bordered._24_8_,(Option *)top_blob_bordered.allocator);
      }
      if ((iVar30 == 1) && (local_f40 == 8)) {
        deconvolution_pack1to8_avx
                  (in_stack_ffffffffffffe8d8,
                   (Mat *)CONCAT17(in_stack_ffffffffffffe8d7,in_stack_ffffffffffffe8d0),
                   in_stack_ffffffffffffe8c8,
                   (Mat *)CONCAT17(in_stack_ffffffffffffe8c7,in_stack_ffffffffffffe8c0),
                   (int)((ulong)in_stack_ffffffffffffe8b8 >> 0x20),(int)in_stack_ffffffffffffe8b8,
                   *(int *)(in_RDI + 0xe0),*(int *)(in_RDI + 0xe4),*(int *)(in_RDI + 0xe8),
                   *(int *)(in_RDI + 0x114),iVar29 + 0x118,in_RCX,
                   (Option *)in_stack_ffffffffffffe5f8);
      }
      if ((iVar30 == 8) && (local_f40 == 1)) {
        deconvolution_pack8to1_avx
                  (in_stack_ffffffffffffe858,in_stack_ffffffffffffe850,in_stack_ffffffffffffe848,
                   in_stack_ffffffffffffe840,(int)((ulong)in_stack_ffffffffffffe838 >> 0x20),
                   (int)in_stack_ffffffffffffe838,*(int *)(in_RDI + 0xe0),*(int *)(in_RDI + 0xe4),
                   *(int *)(in_RDI + 0xe8),*(int *)(in_RDI + 0x114),iVar29 + 0x118,in_RCX,
                   (Option *)in_stack_ffffffffffffe5f8);
      }
      if ((iVar30 == 4) && (local_f40 == 4)) {
        deconvolution_pack4_sse
                  (in_stack_ffffffffffffe8c8,
                   (Mat *)CONCAT17(in_stack_ffffffffffffe8c7,in_stack_ffffffffffffe8c0),
                   in_stack_ffffffffffffe8b8,in_stack_ffffffffffffe8b0,
                   (int)((ulong)in_stack_ffffffffffffe8a8 >> 0x20),(int)in_stack_ffffffffffffe8a8,
                   (int)outm_1.elemsize,outm_1.elempack,(int)outm_1.allocator,outm_1.dims,outm_1.h,
                   (Mat *)outm_1._56_8_,(Option *)outm_1.cstep);
      }
      if ((iVar30 == 1) && (local_f40 == 4)) {
        deconvolution_pack1to4_sse
                  (in_stack_ffffffffffffe828,in_stack_ffffffffffffe820,in_stack_ffffffffffffe818,
                   in_stack_ffffffffffffe810,(int)((ulong)in_stack_ffffffffffffe808 >> 0x20),
                   (int)in_stack_ffffffffffffe808,in_stack_00000668,in_stack_00000670,(int)kptr,
                   (int)sum,i_11,_outw_1,_h_1);
      }
      if ((iVar30 == 4) && (local_f40 == 1)) {
        deconvolution_pack4to1_sse
                  (in_stack_ffffffffffffe808,in_stack_ffffffffffffe800,
                   (Mat *)CONCAT44(in_stack_ffffffffffffe7fc,in_stack_ffffffffffffe7f8),
                   (Mat *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
                   in_stack_ffffffffffffe7ec,in_stack_ffffffffffffe7e8,in_stack_ffffffffffffec18,
                   in_stack_ffffffffffffec20,in_stack_ffffffffffffec28,in_stack_ffffffffffffec30,
                   in_stack_ffffffffffffec38,
                   (Mat *)CONCAT44(in_stack_ffffffffffffec44,in_stack_ffffffffffffec40),
                   (Option *)CONCAT44(in_stack_ffffffffffffec4c,in_stack_ffffffffffffec48));
      }
      if ((iVar30 == 1) && (local_f40 == 1)) {
        for (local_134c = 0; local_134c < *(int *)(in_RDI + 0xd0); local_134c = local_134c + 1) {
          local_1358 = (void **)((long)&weight_data_packed_00->data +
                                local_f58 * local_134c * (long)bottom_blob_02);
          local_3d0 = &stack0xffffffffffffec60;
          local_3c0 = (long)local_f6c * (long)local_f68 * (long)bottom_blob_02;
          local_3c4 = 0x10;
          local_3dc = local_f64;
          local_3f4 = local_f80;
          iVar29 = *(int *)((long)in_RSI + 0x2c);
          iVar28 = (int)in_RSI[6];
          iVar30 = (int)in_RSI[7];
          iVar26 = local_f68;
          iVar27 = local_f6c;
          local_3e8 = local_1358;
          for (iVar25 = 0; iVar25 < iVar26; iVar25 = iVar25 + 1) {
            for (iVar19 = 0; iVar19 < iVar27; iVar19 = iVar19 + 1) {
              local_19d4 = 0.0;
              if (*(int *)(in_RDI + 0x10c) != 0) {
                local_19d4 = *(float *)(*(long *)(in_RDI + 0x1b0) + (long)local_134c * 4);
              }
              local_524 = *(int *)(in_RDI + 0x234);
              local_528 = *(int *)(in_RDI + 0x238);
              local_52c = *(undefined4 *)(in_RDI + 0x23c);
              local_538 = *(long *)(in_RDI + 0x208) +
                          *(long *)(in_RDI + 0x248) * (long)local_134c * *(long *)(in_RDI + 0x218);
              local_540 = *(long *)(in_RDI + 0x218);
              local_544 = *(undefined4 *)(in_RDI + 0x220);
              local_550 = *(undefined8 *)(in_RDI + 0x228);
              local_520 = &stack0xffffffffffffebf0;
              local_360 = (long)local_524 * (long)local_528 * local_540;
              local_364 = 0x10;
              lVar17 = local_538;
              for (iVar24 = 0; iVar24 < iVar30; iVar24 = iVar24 + 1) {
                local_4ec = *(int *)((long)in_RSI + 0x2c);
                local_4f0 = (int)in_RSI[6];
                local_4f4 = *(undefined4 *)((long)in_RSI + 0x34);
                local_500 = *in_RSI + in_RSI[8] * (long)iVar24 * in_RSI[2];
                local_508 = in_RSI[2];
                local_50c = (undefined4)in_RSI[3];
                local_518 = in_RSI[4];
                local_4e8 = &local_1460;
                local_370 = (long)local_4ec * (long)local_4f0 * local_508;
                local_374 = 0x10;
                for (local_1464 = 0; local_1464 < *(int *)(in_RDI + 0xd8);
                    local_1464 = local_1464 + 1) {
                  iVar14 = (iVar25 + local_1464 * *(int *)(in_RDI + 0xe0)) - iVar1 * (iVar2 + -1);
                  if (((-1 < iVar14) && (iVar14 % *(int *)(in_RDI + 0xe8) == 0)) &&
                     (iVar14 = iVar14 / *(int *)(in_RDI + 0xe8), iVar14 < iVar28)) {
                    for (local_147c = 0; local_147c < *(int *)(in_RDI + 0xd4);
                        local_147c = local_147c + 1) {
                      iVar15 = (iVar19 + local_147c * *(int *)(in_RDI + 0xdc)) - iVar13;
                      if (((-1 < iVar15) && (iVar15 % *(int *)(in_RDI + 0xe4) == 0)) &&
                         (iVar15 = iVar15 / *(int *)(in_RDI + 0xe4), iVar15 < iVar29)) {
                        local_19d4 = *(float *)(local_500 +
                                                (long)local_4ec * (long)iVar14 * local_508 +
                                               (long)iVar15 * 4) *
                                     *(float *)(lVar17 + (long)(local_1464 * *(int *)(in_RDI + 0xd4)
                                                               + local_147c) * 4) + local_19d4;
                      }
                    }
                  }
                }
                lVar17 = lVar17 + (long)local_fac * 4;
                local_1460 = 0;
                local_1450 = 0;
                local_1448 = 0;
                local_1438 = 0;
                local_1434 = 0;
                local_1430 = 0;
                local_142c = 0;
                local_1428 = 0;
                local_1420 = 0;
                local_1458 = 0;
                local_1440 = local_518;
              }
              local_5a8 = *(undefined4 *)(in_RDI + 0x114);
              local_5b0 = (long *)(in_RDI + 0x118);
              local_5a4[0] = local_19d4;
              switch(local_5a8) {
              case 1:
                auVar3 = vmaxss_avx(ZEXT416((uint)local_19d4),(undefined1  [16])0x0);
                local_5a4[0] = auVar3._0_4_;
                break;
              case 2:
                local_560 = 0;
                local_5b4 = *(float *)*local_5b0;
                if (local_19d4 <= 0.0) {
                  local_19d4 = local_19d4 * local_5b4;
                }
                local_5a4[0] = local_19d4;
                local_558 = local_5b0;
                break;
              case 3:
                local_570 = 0;
                local_5b8 = *(float *)*local_5b0;
                local_580 = 1;
                local_5bc = *(float *)(*local_5b0 + 4);
                if (local_19d4 < local_5b8) {
                  local_5a4[0] = local_5b8;
                }
                local_578 = local_5b0;
                local_568 = local_5b0;
                if (local_5bc < local_5a4[0]) {
                  local_5a4[0] = local_5bc;
                }
                break;
              case 4:
                local_5c0 = 88.37626;
                pfVar18 = std::min<float>(local_5a4,&local_5c0);
                local_5a4[0] = *pfVar18;
                local_5c4 = -88.37626;
                pfVar18 = std::max<float>(local_5a4,&local_5c4);
                local_5a4[0] = *pfVar18;
                fVar22 = expf(-local_5a4[0]);
                local_5a4[0] = 1.0 / (fVar22 + 1.0);
                break;
              case 5:
                fVar22 = expf(local_19d4);
                fVar22 = logf(fVar22 + 1.0);
                local_5a4[0] = tanhf(fVar22);
                local_5a4[0] = local_19d4 * local_5a4[0];
                break;
              case 6:
                local_590 = 0;
                fVar22 = *(float *)*local_5b0;
                local_5a4[1] = 1.4013e-45;
                local_5a4[2] = 0.0;
                fVar23 = -*(float *)(*local_5b0 + 4) / fVar22;
                local_598 = local_5b0;
                local_588 = local_5b0;
                if (fVar23 <= local_19d4) {
                  if (local_19d4 <= 1.0 / fVar22 + fVar23) {
                    local_5a4[0] = local_19d4 * (local_19d4 * fVar22 + *(float *)(*local_5b0 + 4));
                  }
                }
                else {
                  local_5a4[0] = 0.0;
                }
              }
              *(float *)((long)local_1358 + (long)iVar19 * 4) = local_5a4[0];
            }
            local_1358 = (void **)((long)local_1358 + (long)iVar27 * 4);
          }
        }
      }
    }
    else {
      local_208 = &local_ff8;
      local_ff8 = (void *)*in_RSI;
      local_ff0 = (int *)in_RSI[1];
      local_fe8 = in_RSI[2];
      local_fe0 = (undefined4)in_RSI[3];
      local_fd8 = (long *)in_RSI[4];
      local_fd0 = (undefined4)in_RSI[5];
      local_fc4 = *(undefined4 *)((long)in_RSI + 0x34);
      local_fc0 = (undefined4)in_RSI[7];
      local_fb8 = in_RSI[8];
      if (local_ff0 != (int *)0x0) {
        local_20c = 1;
        LOCK();
        local_210 = *local_ff0;
        *local_ff0 = *local_ff0 + 1;
        UNLOCK();
      }
      local_fcc = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6];
      local_fc8 = 1;
      local_1040 = (void *)0x0;
      local_1038 = (int *)0x0;
      local_1030 = 0;
      local_1028 = 0;
      local_1020 = (long *)0x0;
      local_1018 = 0;
      local_1014 = 0;
      local_1010 = 0;
      local_100c = 0;
      local_1008 = 0;
      local_1000 = 0;
      auVar21._0_8_ = in_RCX->data;
      auVar21._8_8_ = in_RCX->refcount;
      auVar21._16_8_ = in_RCX->elemsize;
      auVar21._24_4_ = in_RCX->elempack;
      auVar21._28_4_ = *(undefined4 *)&in_RCX->field_0x1c;
      auVar21._32_8_ = in_RCX->allocator;
      auVar21._40_4_ = in_RCX->dims;
      auVar21._44_4_ = in_RCX->w;
      auVar21._48_4_ = in_RCX->h;
      auVar21._52_4_ = in_RCX->d;
      auVar21._56_4_ = in_RCX->c;
      auVar21._60_4_ = *(undefined4 *)&in_RCX->field_0x3c;
      auVar21 = vmovdqu64_avx512f(auVar21);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auStack_1070 = auVar21._16_48_;
      local_1080 = auVar21._0_8_;
      plStack_1078 = local_f78;
      local_1084 = (**(code **)(**(long **)(in_RDI + 0x200) + 0x38))
                             (*(long **)(in_RDI + 0x200),&local_ff8,&local_1040,&local_1080);
      if (local_1084 == 0) {
        local_1088 = (((iVar29 + -1) * iVar26 + iVar13 + 1 + iVar27) * *(int *)(in_RDI + 0xe8) -
                     iVar29 * *(int *)(in_RDI + 0xe4)) * local_f40;
        if (local_f40 == 0x10) {
          for (local_108c = 0; local_108c < iVar19; local_108c = local_108c + 1) {
            local_1098 = (undefined1 (*) [64])
                         ((long)local_1040 +
                         (long)local_1014 * (long)(local_108c * local_fac) * local_1030);
            local_4c8 = (void **)((long)&weight_data_packed_00->data +
                                 local_f58 * local_108c * (long)bottom_blob_02);
            local_4b0 = &local_10e0;
            local_380 = (long)local_f6c * (long)local_f68 * (long)bottom_blob_02;
            local_10a0._0_4_ =
                 (int)((local_380 + 0xfU & 0xfffffffffffffff0) / (ulong)bottom_blob_02);
            if (local_f70 == 4) {
              local_10a0._0_4_ = local_f6c * local_f68;
            }
            bVar20 = true;
            if (*(long *)(in_RDI + 0x1b0) != 0) {
              bVar20 = *(long *)(in_RDI + 0x1f0) * (long)*(int *)(in_RDI + 0x1e8) == 0;
              local_238 = (long *)(in_RDI + 0x1b0);
            }
            if (bVar20) {
              local_250 = &local_10e0;
              local_a90 = local_4c8;
              for (local_a94 = 0; local_a94 < (int)local_10a0 * local_f64; local_a94 = local_a94 + 1
                  ) {
                local_188 = local_a90;
                local_200 = 0;
                uStack_1f8 = 0;
                uStack_1f0 = 0;
                uStack_1e8 = 0;
                uStack_1e0 = 0;
                uStack_1d8 = 0;
                uStack_1d0 = 0;
                uStack_1c8 = 0;
                *local_a90 = (void *)0x0;
                local_a90[1] = (int *)0x0;
                local_a90[2] = (void *)0x0;
                local_a90[3] = (void *)0x0;
                local_a90[4] = (Allocator *)0x0;
                local_a90[5] = (void *)0x0;
                local_a90[6] = (void *)0x0;
                local_a90[7] = (void *)0x0;
                local_a90 = local_a90 + 8;
              }
            }
            else {
              puVar16 = (undefined8 *)(*(long *)(in_RDI + 0x1b0) + (long)(local_108c << 4) * 4);
              pvVar4 = (void *)*puVar16;
              piVar5 = (int *)puVar16[1];
              sVar10 = puVar16[2];
              uVar7 = puVar16[3];
              pAVar6 = (Allocator *)puVar16[4];
              uVar8 = puVar16[5];
              uVar9 = puVar16[6];
              uVar11 = puVar16[7];
              local_248 = &local_10e0;
              local_b10 = local_4c8;
              for (local_b14 = 0; local_b14 < (int)local_10a0 * local_f64; local_b14 = local_b14 + 1
                  ) {
                local_128 = local_b10;
                *local_b10 = pvVar4;
                local_b10[1] = piVar5;
                local_b10[2] = (void *)sVar10;
                local_b10[3] = (void *)uVar7;
                local_b10[4] = pAVar6;
                local_b10[5] = (void *)uVar8;
                local_b10[6] = (void *)uVar9;
                local_b10[7] = (void *)uVar11;
                local_b10 = local_b10 + 8;
                local_180 = pvVar4;
                piStack_178 = piVar5;
                sStack_170 = sVar10;
                uStack_168 = uVar7;
                pAStack_160 = pAVar6;
                uStack_158 = uVar8;
                uStack_150 = uVar9;
                uStack_148 = uVar11;
              }
            }
            for (local_10e4 = 0; local_10e4 < *(int *)(in_RDI + 0xd8); local_10e4 = local_10e4 + 1)
            {
              for (local_10e8 = 0; local_10e8 < *(int *)(in_RDI + 0xd4); local_10e8 = local_10e8 + 1
                  ) {
                local_10f0 = (undefined1 (*) [64])
                             ((long)local_4c8 +
                             (long)(*(int *)(in_RDI + 0xdc) * local_10e8 * 0x10) * 4 +
                             (long)local_f6c * (long)(*(int *)(in_RDI + 0xe0) * local_10e4) *
                             (long)bottom_blob_02);
                for (local_10f4 = 0; local_10f4 < iVar28; local_10f4 = local_10f4 + 1) {
                  for (local_10f8 = 0; local_10f8 < iVar29; local_10f8 = local_10f8 + 1) {
                    local_1180 = *(undefined8 *)*local_1098;
                    uStack_1178 = *(undefined8 *)(*local_1098 + 8);
                    uStack_1170 = *(undefined8 *)(*local_1098 + 0x10);
                    uStack_1168 = *(undefined8 *)(*local_1098 + 0x18);
                    uStack_1160 = *(undefined8 *)(*local_1098 + 0x20);
                    uStack_1158 = *(undefined8 *)(*local_1098 + 0x28);
                    uStack_1150 = *(undefined8 *)(*local_1098 + 0x30);
                    uStack_1148 = *(undefined8 *)(*local_1098 + 0x38);
                    auVar21 = vaddps_avx512f(*local_10f0,*local_1098);
                    top_blob_00 = auVar21._0_8_;
                    bottom_blob_00 = auVar21._8_8_;
                    bias_data = auVar21._16_8_;
                    weight_data_packed = auVar21._24_8_;
                    top_blob_01 = auVar21._32_8_;
                    bottom_blob_01 = auVar21._40_8_;
                    uStack_16d0 = auVar21._48_8_;
                    uStack_1110 = uStack_16d0;
                    uStack_16c8 = auVar21._56_8_;
                    uStack_1108 = uStack_16c8;
                    *(Mat **)*local_10f0 = top_blob_00;
                    *(Mat **)(*local_10f0 + 8) = bottom_blob_00;
                    *(Mat **)(*local_10f0 + 0x10) = bias_data;
                    *(Mat **)(*local_10f0 + 0x18) = weight_data_packed;
                    *(Mat **)(*local_10f0 + 0x20) = top_blob_01;
                    *(Mat **)(*local_10f0 + 0x28) = bottom_blob_01;
                    *(undefined8 *)(*local_10f0 + 0x30) = uStack_16d0;
                    *(undefined8 *)(*local_10f0 + 0x38) = uStack_16c8;
                    local_10f0 = (undefined1 (*) [64])
                                 (*local_10f0 + (long)(*(int *)(in_RDI + 0xe4) << 4) * 4);
                    local_1098 = local_1098 + 1;
                    local_1140 = top_blob_00;
                    uStack_1138 = bottom_blob_00;
                    uStack_1130 = bias_data;
                    uStack_1128 = weight_data_packed;
                    uStack_1120 = top_blob_01;
                    uStack_1118 = bottom_blob_01;
                  }
                  local_10f0 = (undefined1 (*) [64])(*local_10f0 + (long)local_1088 * 4);
                }
              }
            }
            local_10c0 = local_f78;
            local_384 = 0x10;
            local_4bc = local_f64;
            local_4d4 = local_f80;
            local_10e0 = 0;
            local_10d0 = 0;
            local_10c8 = 0;
            local_10b8 = 0;
            local_10b4 = 0;
            local_10b0 = 0;
            local_10ac = 0;
            local_10a8 = 0;
            local_10a0 = 0;
            local_10d8 = 0;
          }
        }
        if (local_f40 == 8) {
          for (local_1184 = 0; local_1184 < iVar19; local_1184 = local_1184 + 1) {
            local_1190 = (undefined8 *)
                         ((long)local_1040 +
                         (long)local_1014 * (long)(local_1184 * local_fac) * local_1030);
            local_484 = local_f64;
            local_490 = (Allocator **)
                        ((long)&weight_data_packed_00->data +
                        local_f58 * local_1184 * (long)bottom_blob_02);
            local_49c = local_f80;
            local_478 = &local_11d8;
            local_11b8 = local_f78;
            local_390 = (long)local_f6c * (long)local_f68 * (long)bottom_blob_02;
            local_394 = 0x10;
            local_1198._0_4_ =
                 (int)((local_390 + 0xfU & 0xfffffffffffffff0) / (ulong)bottom_blob_02);
            if (local_f70 == 4) {
              local_1198._0_4_ = local_f6c * local_f68;
            }
            bVar20 = true;
            if (*(long *)(in_RDI + 0x1b0) != 0) {
              bVar20 = *(long *)(in_RDI + 0x1f0) * (long)*(int *)(in_RDI + 0x1e8) == 0;
              local_230 = (long *)(in_RDI + 0x1b0);
            }
            if (bVar20) {
              local_260 = &local_11d8;
              local_850 = local_490;
              for (local_854 = 0; local_854 < (int)local_1198 * local_f64; local_854 = local_854 + 1
                  ) {
                local_e8 = local_850;
                local_120 = 0;
                uStack_118 = 0;
                uStack_110 = 0;
                uStack_108 = 0;
                *local_850 = (Allocator *)0x0;
                local_850[1] = (Allocator *)0x0;
                local_850[2] = (Allocator *)0x0;
                local_850[3] = (Allocator *)0x0;
                local_850 = local_850 + 4;
              }
            }
            else {
              puVar16 = (undefined8 *)(*(long *)(in_RDI + 0x1b0) + (long)(local_1184 << 3) * 4);
              pAVar6 = (Allocator *)*puVar16;
              uVar7 = puVar16[1];
              uVar8 = puVar16[2];
              uVar9 = puVar16[3];
              local_258 = &local_11d8;
              local_890 = local_490;
              for (local_894 = 0; local_894 < (int)local_1198 * local_f64; local_894 = local_894 + 1
                  ) {
                local_b8 = local_890;
                *local_890 = pAVar6;
                local_890[1] = (Allocator *)uVar7;
                local_890[2] = (Allocator *)uVar8;
                local_890[3] = (Allocator *)uVar9;
                local_890 = local_890 + 4;
                local_e0 = pAVar6;
                uStack_d8 = uVar7;
                uStack_d0 = uVar8;
                uStack_c8 = uVar9;
              }
            }
            for (local_11dc = 0; local_11dc < *(int *)(in_RDI + 0xd8); local_11dc = local_11dc + 1)
            {
              for (local_11e0 = 0; local_11e0 < *(int *)(in_RDI + 0xd4); local_11e0 = local_11e0 + 1
                  ) {
                local_11e8 = (undefined1 (*) [24])
                             ((long)local_490 +
                             (long)(*(int *)(in_RDI + 0xdc) * local_11e0 * 8) * 4 +
                             (long)local_f6c * (long)(*(int *)(in_RDI + 0xe0) * local_11dc) *
                             (long)bottom_blob_02);
                for (local_11ec = 0; local_11ec < iVar28; local_11ec = local_11ec + 1) {
                  for (local_11f0 = 0; local_11f0 < iVar29; local_11f0 = local_11f0 + 1) {
                    auVar12 = *local_11e8;
                    local_1240 = *local_1190;
                    uStack_1238 = local_1190[1];
                    uStack_1230 = local_1190[2];
                    uStack_1228 = local_1190[3];
                    local_7a0 = auVar12._0_4_;
                    fStack_79c = auVar12._4_4_;
                    fStack_798 = auVar12._8_4_;
                    fStack_794 = auVar12._12_4_;
                    fStack_790 = auVar12._16_4_;
                    fStack_78c = auVar12._20_4_;
                    fStack_788 = (float)*(undefined8 *)local_11e8[1];
                    fStack_784 = (float)((ulong)*(undefined8 *)local_11e8[1] >> 0x20);
                    local_7c0 = (float)local_1240;
                    fStack_7bc = (float)((ulong)local_1240 >> 0x20);
                    fStack_7b8 = (float)uStack_1238;
                    fStack_7b4 = (float)((ulong)uStack_1238 >> 0x20);
                    fStack_7b0 = (float)uStack_1230;
                    fStack_7ac = (float)((ulong)uStack_1230 >> 0x20);
                    fStack_7a8 = (float)uStack_1228;
                    fStack_7a4 = (float)((ulong)uStack_1228 >> 0x20);
                    local_1220 = CONCAT44(fStack_79c + fStack_7bc,local_7a0 + local_7c0);
                    uStack_1218 = CONCAT44(fStack_794 + fStack_7b4,fStack_798 + fStack_7b8);
                    uStack_1210 = CONCAT44(fStack_78c + fStack_7ac,fStack_790 + fStack_7b0);
                    uStack_1208 = CONCAT44(fStack_784 + fStack_7a4,fStack_788 + fStack_7a8);
                    *(undefined8 *)*local_11e8 = local_1220;
                    *(undefined8 *)(*local_11e8 + 8) = uStack_1218;
                    *(undefined8 *)(*local_11e8 + 0x10) = uStack_1210;
                    *(undefined8 *)local_11e8[1] = uStack_1208;
                    local_11e8 = (undefined1 (*) [24])
                                 (*local_11e8 + (long)(*(int *)(in_RDI + 0xe4) << 3) * 4);
                    local_1190 = local_1190 + 4;
                  }
                  local_11e8 = (undefined1 (*) [24])(*local_11e8 + (long)local_1088 * 4);
                }
              }
            }
            local_11d8 = 0;
            local_11c8 = 0;
            local_11c0 = 0;
            local_11b0 = 0;
            local_11ac = 0;
            local_11a8 = 0;
            local_11a4 = 0;
            local_11a0 = 0;
            local_1198 = 0;
            local_11d0 = 0;
          }
        }
        if (local_f40 == 4) {
          for (local_1244 = 0; local_1244 < iVar19; local_1244 = local_1244 + 1) {
            local_1250 = (undefined8 *)
                         ((long)local_1040 +
                         (long)local_1014 * (long)(local_1244 * local_fac) * local_1030);
            local_458 = (void **)((long)&weight_data_packed_00->data +
                                 local_f58 * local_1244 * (long)bottom_blob_02);
            local_440 = &local_1298;
            local_1278 = local_f78;
            local_3a0 = (long)local_f6c * (long)local_f68 * (long)bottom_blob_02;
            local_1258._0_4_ =
                 (int)((local_3a0 + 0xfU & 0xfffffffffffffff0) / (ulong)bottom_blob_02);
            if (local_f70 == 4) {
              local_1258._0_4_ = local_f6c * local_f68;
            }
            local_3a4 = 0x10;
            local_44c = local_f64;
            local_464 = local_f80;
            bVar20 = true;
            if (*(long *)(in_RDI + 0x1b0) != 0) {
              bVar20 = *(long *)(in_RDI + 0x1f0) * (long)*(int *)(in_RDI + 0x1e8) == 0;
              local_228 = (long *)(in_RDI + 0x1b0);
            }
            if (bVar20) {
              local_270 = &local_1298;
              local_720 = local_458;
              for (local_724 = 0; local_724 < (int)local_1258 * local_f64; local_724 = local_724 + 1
                  ) {
                local_98 = local_720;
                local_b0 = 0;
                uStack_a8 = 0;
                *local_720 = (void *)0x0;
                local_720[1] = (int *)0x0;
                local_720 = local_720 + 2;
              }
            }
            else {
              puVar16 = (undefined8 *)(*(long *)(in_RDI + 0x1b0) + (long)(local_1244 << 2) * 4);
              pvVar4 = (void *)*puVar16;
              piVar5 = (int *)puVar16[1];
              local_268 = &local_1298;
              local_750 = local_458;
              for (iVar30 = 0; iVar30 < (int)local_1258 * local_f64; iVar30 = iVar30 + 1) {
                local_78 = local_750;
                *local_750 = pvVar4;
                local_750[1] = piVar5;
                local_750 = local_750 + 2;
                local_90 = pvVar4;
                piStack_88 = piVar5;
              }
            }
            for (local_129c = 0; local_129c < *(int *)(in_RDI + 0xd8); local_129c = local_129c + 1)
            {
              for (local_12a0 = 0; local_12a0 < *(int *)(in_RDI + 0xd4); local_12a0 = local_12a0 + 1
                  ) {
                local_12a8 = (undefined8 *)
                             ((long)local_458 +
                             (long)(*(int *)(in_RDI + 0xdc) * local_12a0 * 4) * 4 +
                             (long)local_f6c * (long)(*(int *)(in_RDI + 0xe0) * local_129c) *
                             (long)bottom_blob_02);
                for (local_12ac = 0; local_12ac < iVar28; local_12ac = local_12ac + 1) {
                  for (local_12b0 = 0; local_12b0 < iVar29; local_12b0 = local_12b0 + 1) {
                    local_12d0 = *local_1250;
                    uStack_12c8 = local_1250[1];
                    local_6b0 = (float)*local_12a8;
                    fStack_6ac = (float)((ulong)*local_12a8 >> 0x20);
                    fStack_6a8 = (float)local_12a8[1];
                    fStack_6a4 = (float)((ulong)local_12a8[1] >> 0x20);
                    local_6c0 = (float)local_12d0;
                    fStack_6bc = (float)((ulong)local_12d0 >> 0x20);
                    fStack_6b8 = (float)uStack_12c8;
                    fStack_6b4 = (float)((ulong)uStack_12c8 >> 0x20);
                    local_12c0 = CONCAT44(fStack_6ac + fStack_6bc,local_6b0 + local_6c0);
                    uStack_12b8 = CONCAT44(fStack_6a4 + fStack_6b4,fStack_6a8 + fStack_6b8);
                    *local_12a8 = local_12c0;
                    local_12a8[1] = uStack_12b8;
                    local_12a8 = (undefined8 *)
                                 ((long)local_12a8 + (long)(*(int *)(in_RDI + 0xe4) << 2) * 4);
                    local_1250 = local_1250 + 2;
                  }
                  local_12a8 = (undefined8 *)((long)local_12a8 + (long)local_1088 * 4);
                }
              }
            }
            local_1298 = 0;
            local_1288 = 0;
            local_1280 = 0;
            local_1270 = 0;
            local_126c = 0;
            local_1268 = 0;
            local_1264 = 0;
            local_1260 = 0;
            local_1258 = 0;
            local_1290 = 0;
          }
        }
        if (local_f40 == 1) {
          for (local_12d4 = 0; local_12d4 < iVar19; local_12d4 = local_12d4 + 1) {
            local_12e0 = (float *)((long)local_1040 +
                                  (long)local_1014 * (long)(local_12d4 * local_fac) * local_1030);
            local_420 = (void **)((long)&weight_data_packed_00->data +
                                 local_f58 * local_12d4 * (long)bottom_blob_02);
            local_408 = &local_1328;
            local_1308 = local_f78;
            local_3b0 = (long)local_f6c * (long)local_f68 * (long)bottom_blob_02;
            local_12e8._0_4_ =
                 (int)((local_3b0 + 0xfU & 0xfffffffffffffff0) / (ulong)bottom_blob_02);
            if (local_f70 == 4) {
              local_12e8._0_4_ = local_f6c * local_f68;
            }
            local_3b4 = 0x10;
            local_414 = local_f64;
            local_42c = local_f80;
            bVar20 = true;
            if (*(long *)(in_RDI + 0x1b0) != 0) {
              bVar20 = *(long *)(in_RDI + 0x1f0) * (long)*(int *)(in_RDI + 0x1e8) == 0;
              local_220 = (long *)(in_RDI + 0x1b0);
            }
            if (bVar20) {
              local_1910 = 0;
            }
            else {
              local_1910 = *(undefined4 *)(*(long *)(in_RDI + 0x1b0) + (long)local_12d4 * 4);
            }
            local_278 = &local_1328;
            local_660 = local_420;
            for (local_664 = 0; local_664 < (int)local_12e8 * local_f64; local_664 = local_664 + 1)
            {
              *(undefined4 *)local_660 = local_1910;
              local_660 = (void **)((long)local_660 + 4);
            }
            for (local_1330 = 0; local_1330 < *(int *)(in_RDI + 0xd8); local_1330 = local_1330 + 1)
            {
              for (local_1334 = 0; local_1334 < *(int *)(in_RDI + 0xd4); local_1334 = local_1334 + 1
                  ) {
                local_1340 = (float *)((long)local_420 +
                                      (long)(*(int *)(in_RDI + 0xdc) * local_1334) * 4 +
                                      (long)local_f6c * (long)(*(int *)(in_RDI + 0xe0) * local_1330)
                                      * (long)bottom_blob_02);
                for (local_1344 = 0; local_1344 < iVar28; local_1344 = local_1344 + 1) {
                  for (local_1348 = 0; local_1348 < iVar29; local_1348 = local_1348 + 1) {
                    *local_1340 = *local_12e0 + *local_1340;
                    local_1340 = local_1340 + *(int *)(in_RDI + 0xe4);
                    local_12e0 = local_12e0 + 1;
                  }
                  local_1340 = local_1340 + local_1088;
                }
              }
            }
            local_1328 = 0;
            local_1318 = 0;
            local_1310 = 0;
            local_1300 = 0;
            local_12fc = 0;
            local_12f8 = 0;
            local_12f4 = 0;
            local_12f0 = 0;
            local_12e8 = 0;
            local_1320 = 0;
          }
        }
        if (*(long *)(in_RDI + 0x1f8) != 0) {
          (**(code **)(**(long **)(in_RDI + 0x1f8) + 0x48))
                    (*(long **)(in_RDI + 0x1f8),&stack0xfffffffffffff068,in_RCX);
        }
        iVar29 = 0;
      }
      else {
        iVar29 = 1;
        local_ef4 = local_1084;
      }
      if (local_1038 != (int *)0x0) {
        LOCK();
        iVar28 = *local_1038;
        *local_1038 = *local_1038 + -1;
        UNLOCK();
        if (iVar28 == 1) {
          if (local_1020 == (long *)0x0) {
            local_2e0 = local_1040;
            if (local_1040 != (void *)0x0) {
              free(local_1040);
            }
          }
          else {
            (**(code **)(*local_1020 + 0x18))(local_1020,local_1040);
          }
        }
      }
      local_1040 = (void *)0x0;
      local_1030 = 0;
      local_1028 = 0;
      local_1018 = 0;
      local_1014 = 0;
      local_1010 = 0;
      local_100c = 0;
      local_1008 = 0;
      local_1000 = 0;
      local_1038 = (int *)0x0;
      if (local_ff0 != (int *)0x0) {
        LOCK();
        iVar28 = *local_ff0;
        *local_ff0 = *local_ff0 + -1;
        UNLOCK();
        if (iVar28 == 1) {
          if (local_fd8 == (long *)0x0) {
            local_2d0 = local_ff8;
            if (local_ff8 != (void *)0x0) {
              free(local_ff8);
            }
          }
          else {
            (**(code **)(*local_fd8 + 0x18))(local_fd8,local_ff8);
          }
        }
      }
      local_ff8 = (void *)0x0;
      local_fe8 = 0;
      local_fe0 = 0;
      local_fd0 = 0;
      local_fcc = 0;
      local_fc8 = 0;
      local_fc4 = 0;
      local_fc0 = 0;
      local_fb8 = 0;
      local_ff0 = (int *)0x0;
      if (iVar29 != 0) goto LAB_009bd4db;
    }
    Deconvolution::cut_padding
              ((Deconvolution *)CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
               in_stack_ffffffffffffe608,in_stack_ffffffffffffe600,
               (Option *)in_stack_ffffffffffffe5f8);
    bVar20 = true;
    if (*in_RDX != 0) {
      bVar20 = in_RDX[8] * (long)(int)in_RDX[7] == 0;
    }
    if (bVar20) {
      local_ef4 = -100;
    }
    else {
      local_ef4 = 0;
    }
  }
  else {
    local_ef4 = -100;
  }
LAB_009bd4db:
  puVar16 = (undefined8 *)&stack0xfffffffffffff068;
  if (top_blob_02 != (Mat *)0x0) {
    LOCK();
    iVar29 = *(int *)&top_blob_02->data;
    *(int *)&top_blob_02->data = *(int *)&top_blob_02->data + -1;
    UNLOCK();
    if (iVar29 == 1) {
      if (local_f78 == (long *)0x0) {
        if (weight_data_packed_00 != (Mat *)0x0) {
          free(weight_data_packed_00);
        }
      }
      else {
        (**(code **)(*local_f78 + 0x18))(local_f78,weight_data_packed_00);
      }
    }
  }
  *puVar16 = 0;
  puVar16[2] = 0;
  *(undefined4 *)(puVar16 + 3) = 0;
  *(undefined4 *)(puVar16 + 5) = 0;
  *(undefined4 *)((long)puVar16 + 0x2c) = 0;
  *(undefined4 *)(puVar16 + 6) = 0;
  *(undefined4 *)((long)puVar16 + 0x34) = 0;
  *(undefined4 *)(puVar16 + 7) = 0;
  puVar16[8] = 0;
  puVar16[1] = 0;
  return local_ef4;
}

Assistant:

int Deconvolution_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        int ret = gemm->forward(bottom_blob_2, top_col2im, opt_b);
        if (ret != 0)
            return ret;

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_loadu_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_loadu_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_loadu_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}